

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::consume_temporary_in_precision_context
          (CompilerGLSL *this,uint32_t type_id,uint32_t id,Precision precision)

{
  Precision result_type;
  bool bVar1;
  Types TVar2;
  Variant *this_00;
  SPIRType *pSVar3;
  Types *pTVar4;
  pointer ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  string local_110;
  ID local_f0 [4];
  string local_e0 [32];
  undefined1 local_c0 [8];
  string alias_name;
  char *local_98;
  char *prefix;
  Meta *local_88;
  Meta *input_m;
  mapped_type *local_78;
  mapped_type *m;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_68;
  uint32_t alias_id;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_60;
  iterator itr;
  Precision current_precision;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> itr_1;
  SPIRType *type;
  Types handle_type;
  Precision precision_local;
  uint32_t id_local;
  uint32_t type_id_local;
  CompilerGLSL *this_local;
  
  handle_type = id;
  precision_local = type_id;
  _id_local = this;
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>,
                       (ulong)id);
  TVar2 = Variant::get_type(this_00);
  if (((TVar2 == TypeConstant) || (TVar2 == TypeConstantOp)) || (TVar2 == TypeUndef)) {
    this_local._4_4_ = handle_type;
  }
  else {
    pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,precision_local);
    if ((pSVar3->pointer & 1U) == 0) {
      if (((pSVar3->basetype == Float) || (pSVar3->basetype == UInt)) || (pSVar3->basetype == Int))
      {
        if (precision == DontCare) {
          pVar6 = ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::insert(&(this->super_Compiler).forced_temporaries,&handle_type);
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
          }
          this_local._4_4_ = handle_type;
        }
        else {
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)&itr,handle_type);
          bVar1 = Compiler::has_decoration
                            (&this->super_Compiler,
                             itr.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur._0_4_,DecorationRelaxedPrecision);
          itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur.
          _4_4_ = Highp;
          if (bVar1) {
            itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
            ._4_4_ = Mediump;
          }
          if (itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur._4_4_ == precision) {
            this_local._4_4_ = handle_type;
          }
          else {
            local_60._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::find(&this->temporary_to_mirror_precision_alias,&handle_type);
            _Stack_68._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::end(&this->temporary_to_mirror_precision_alias);
            bVar1 = ::std::__detail::operator==(&local_60,&stack0xffffffffffffff98);
            if (bVar1) {
              m._4_4_ = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
              TypedID<(spirv_cross::Types)0>::TypedID
                        ((TypedID<(spirv_cross::Types)0> *)((long)&input_m + 4),m._4_4_);
              local_78 = ::std::
                         unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                         ::operator[](&(this->super_Compiler).ir.meta,
                                      (key_type *)((long)&input_m + 4));
              TypedID<(spirv_cross::Types)0>::TypedID
                        ((TypedID<(spirv_cross::Types)0> *)((long)&prefix + 4),handle_type);
              local_88 = ParsedIR::find_meta(&(this->super_Compiler).ir,prefix._4_4_);
              if (local_88 != (Meta *)0x0) {
                Meta::operator=(local_78,local_88);
              }
              if (precision == Mediump) {
                TypedID<(spirv_cross::Types)0>::TypedID
                          ((TypedID<(spirv_cross::Types)0> *)((long)&alias_name.field_2 + 0xc),
                           m._4_4_);
                Compiler::set_decoration
                          (&this->super_Compiler,(ID)alias_name.field_2._12_4_,
                           DecorationRelaxedPrecision,0);
                local_98 = "mp_copy_";
              }
              else {
                TypedID<(spirv_cross::Types)0>::TypedID
                          ((TypedID<(spirv_cross::Types)0> *)((long)&alias_name.field_2 + 8),m._4_4_
                          );
                Compiler::unset_decoration
                          (&this->super_Compiler,(ID)alias_name.field_2._8_4_,
                           DecorationRelaxedPrecision);
                local_98 = "hp_copy_";
              }
              ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DAT_00000001;
              (*(this->super_Compiler)._vptr_Compiler[6])(local_e0,this,(ulong)handle_type);
              join<char_const*&,std::__cxx11::string>
                        ((string *)local_c0,(spirv_cross *)&local_98,(char **)local_e0,ts_1);
              ::std::__cxx11::string::~string(local_e0);
              ParsedIR::sanitize_underscores((string *)local_c0);
              TypedID<(spirv_cross::Types)0>::TypedID(local_f0,m._4_4_);
              Compiler::set_name(&this->super_Compiler,local_f0[0],(string *)local_c0);
              result_type = precision_local;
              TVar2 = m._4_4_;
              to_expression_abi_cxx11_(&local_110,this,handle_type,true);
              emit_op(this,result_type,TVar2,&local_110,true,false);
              ::std::__cxx11::string::~string((string *)&local_110);
              TVar2 = m._4_4_;
              pTVar4 = ::std::
                       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       ::operator[](&this->temporary_to_mirror_precision_alias,&handle_type);
              *pTVar4 = TVar2;
              ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_Compiler).forced_temporaries,&handle_type);
              ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_Compiler).forced_temporaries,(value_type *)((long)&m + 4));
              Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
              handle_type = m._4_4_;
              ::std::__cxx11::string::~string((string *)local_c0);
            }
            else {
              ppVar5 = ::std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                       operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                   *)&local_60);
              handle_type = ppVar5->second;
            }
            this_local._4_4_ = handle_type;
          }
        }
      }
      else {
        this_local._4_4_ = handle_type;
      }
    }
    else {
      this_local._4_4_ = handle_type;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::consume_temporary_in_precision_context(uint32_t type_id, uint32_t id, Options::Precision precision)
{
	// Constants do not have innate precision.
	auto handle_type = ir.ids[id].get_type();
	if (handle_type == TypeConstant || handle_type == TypeConstantOp || handle_type == TypeUndef)
		return id;

	// Ignore anything that isn't 32-bit values.
	auto &type = get<SPIRType>(type_id);
	if (type.pointer)
		return id;
	if (type.basetype != SPIRType::Float && type.basetype != SPIRType::UInt && type.basetype != SPIRType::Int)
		return id;

	if (precision == Options::DontCare)
	{
		// If precision is consumed as don't care (operations only consisting of constants),
		// we need to bind the expression to a temporary,
		// otherwise we have no way of controlling the precision later.
		auto itr = forced_temporaries.insert(id);
		if (itr.second)
			force_recompile_guarantee_forward_progress();
		return id;
	}

	auto current_precision = has_decoration(id, DecorationRelaxedPrecision) ? Options::Mediump : Options::Highp;
	if (current_precision == precision)
		return id;

	auto itr = temporary_to_mirror_precision_alias.find(id);
	if (itr == temporary_to_mirror_precision_alias.end())
	{
		uint32_t alias_id = ir.increase_bound_by(1);
		auto &m = ir.meta[alias_id];
		if (auto *input_m = ir.find_meta(id))
			m = *input_m;

		const char *prefix;
		if (precision == Options::Mediump)
		{
			set_decoration(alias_id, DecorationRelaxedPrecision);
			prefix = "mp_copy_";
		}
		else
		{
			unset_decoration(alias_id, DecorationRelaxedPrecision);
			prefix = "hp_copy_";
		}

		auto alias_name = join(prefix, to_name(id));
		ParsedIR::sanitize_underscores(alias_name);
		set_name(alias_id, alias_name);

		emit_op(type_id, alias_id, to_expression(id), true);
		temporary_to_mirror_precision_alias[id] = alias_id;
		forced_temporaries.insert(id);
		forced_temporaries.insert(alias_id);
		force_recompile_guarantee_forward_progress();
		id = alias_id;
	}
	else
	{
		id = itr->second;
	}

	return id;
}